

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

PyObject * pybind11::detail::error_string_abi_cxx11_(void)

{
  undefined4 uVar1;
  long lVar2;
  handle in_RDI;
  int lineno;
  PyFrameObject *frame;
  PyTracebackObject *trace;
  error_scope scope;
  string *errorString;
  undefined4 in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  char *pcVar3;
  accessor<pybind11::detail::accessor_policies::str_attr> *in_stack_fffffffffffffde8;
  allocator *paVar4;
  PyObject *this;
  handle local_200;
  string local_1f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  string local_1d8 [4];
  int in_stack_fffffffffffffe2c;
  handle local_1b8;
  string local_1b0 [8];
  str *in_stack_fffffffffffffe58;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [36];
  undefined4 local_cc;
  long local_c8;
  long local_c0;
  handle local_b8 [2];
  string local_a8 [32];
  handle local_88 [5];
  string local_60 [39];
  undefined1 local_39;
  PyObject *local_38;
  PyObject *local_30;
  long local_28 [3];
  allocator local_9 [9];
  
  this = in_RDI.m_ptr;
  lVar2 = PyErr_Occurred();
  if (lVar2 == 0) {
    pcVar3 = "Unknown internal error occurred";
    PyErr_SetString(_PyExc_RuntimeError);
    paVar4 = local_9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI.m_ptr,pcVar3,paVar4);
    std::allocator<char>::~allocator((allocator<char> *)local_9);
  }
  else {
    error_scope::error_scope((error_scope *)0x11826f);
    local_39 = 0;
    std::__cxx11::string::string((string *)in_RDI.m_ptr);
    if (local_38 != (PyObject *)0x0) {
      handle::handle(local_88,local_38);
      object_api<pybind11::handle>::attr((object_api<pybind11::handle> *)this,(char *)in_RDI.m_ptr);
      accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                (in_stack_fffffffffffffde8);
      std::__cxx11::string::operator+=((string *)in_RDI.m_ptr,local_60);
      std::__cxx11::string::~string(local_60);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x11830a);
      std::__cxx11::string::operator+=((string *)in_RDI.m_ptr,": ");
    }
    if (local_30 != (PyObject *)0x0) {
      handle::handle(local_b8,local_30);
      str::str((str *)in_stack_fffffffffffffde8,in_RDI);
      str::operator_cast_to_string(in_stack_fffffffffffffe58);
      std::__cxx11::string::operator+=((string *)in_RDI.m_ptr,local_a8);
      std::__cxx11::string::~string(local_a8);
      str::~str((str *)0x118403);
    }
    PyErr_NormalizeException(&local_38,&local_30,local_28);
    if (local_28[0] != 0) {
      PyException_SetTraceback(local_30,local_28[0]);
    }
    if (local_28[0] != 0) {
      for (local_c0 = local_28[0]; *(long *)(local_c0 + 0x10) != 0;
          local_c0 = *(long *)(local_c0 + 0x10)) {
      }
      local_c8 = *(long *)(local_c0 + 0x18);
      std::__cxx11::string::operator+=((string *)in_RDI.m_ptr,"\n\nAt:\n");
      for (; local_c8 != 0; local_c8 = *(long *)(local_c8 + 0x18)) {
        uVar1 = PyFrame_GetLineNumber(local_c8);
        local_cc = uVar1;
        handle::handle(&local_1b8,*(PyObject **)(*(long *)(local_c8 + 0x20) + 0x68));
        handle::cast<std::__cxx11::string>((handle *)CONCAT44(uVar1,in_stack_fffffffffffffdd8));
        std::operator+((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
        std::__cxx11::to_string(in_stack_fffffffffffffe2c);
        std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
        handle::handle(&local_200,*(PyObject **)(*(long *)(local_c8 + 0x20) + 0x70));
        handle::cast<std::__cxx11::string>((handle *)CONCAT44(uVar1,in_stack_fffffffffffffdd8));
        std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
        std::__cxx11::string::operator+=((string *)in_RDI.m_ptr,local_f0);
        std::__cxx11::string::~string(local_f0);
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string(local_1f8);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string(local_150);
        std::__cxx11::string::~string(local_1d8);
        std::__cxx11::string::~string(local_170);
        std::__cxx11::string::~string(local_190);
        std::__cxx11::string::~string(local_1b0);
      }
    }
    local_39 = 1;
    error_scope::~error_scope((error_scope *)0x11884a);
  }
  return this;
}

Assistant:

PYBIND11_NOINLINE inline std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value)
        errorString += (std::string) str(scope.value);

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr)
        PyException_SetTraceback(scope.value, scope.trace);
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        PyTracebackObject *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next)
            trace = trace->tb_next;

        PyFrameObject *frame = trace->tb_frame;
        errorString += "\n\nAt:\n";
        while (frame) {
            int lineno = PyFrame_GetLineNumber(frame);
            errorString +=
                "  " + handle(frame->f_code->co_filename).cast<std::string>() +
                "(" + std::to_string(lineno) + "): " +
                handle(frame->f_code->co_name).cast<std::string>() + "\n";
            frame = frame->f_back;
        }
    }
#endif

    return errorString;
}